

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappingExample.cpp
# Opt level: O1

double GetMapping<double>(double mapMe,vector<double,_std::allocator<double>_> *mappings)

{
  double dVar1;
  pointer pdVar2;
  ostream *poVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mapping range: ",0xf);
  pdVar2 = (mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    uVar7 = 0;
    do {
      poVar3 = std::ostream::_M_insert<double>(pdVar2[uVar7]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      uVar7 = uVar7 + 1;
      pdVar2 = (mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(mappings->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  pdVar2 = (mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(mappings->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  dVar8 = mapMe;
  if (lVar4 != 0) {
    bVar5 = true;
    uVar7 = 0;
    uVar6 = 0;
    do {
      dVar1 = pdVar2[uVar7];
      uVar6 = uVar6 + (dVar1 < mapMe);
      uVar7 = (ulong)uVar6;
      if (mapMe <= dVar1) {
        bVar5 = false;
        dVar8 = dVar1;
      }
    } while ((uVar7 < (ulong)(lVar4 >> 3)) && (bVar5));
  }
  poVar3 = std::ostream::_M_insert<double>(mapMe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is mapped to ",0xe);
  poVar3 = std::ostream::_M_insert<double>(dVar8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return dVar8;
}

Assistant:

MapType GetMapping(MapType mapMe, vector<MapType> mappings){
   MapType result = mapMe;
   int i;
   bool keepLooking;

   keepLooking = true;

   cout << endl;
   cout << "Mapping range: ";
   for (i = 0; i < mappings.size(); ++i) {
      cout << mappings.at(i) << " ";
   }
   cout << endl;

   i = 0;       // Restart counting
   while ((i < mappings.size()) && keepLooking) {
      if(mapMe <= mappings.at(i)) {
         result = mappings.at(i);
         keepLooking = false;
      }
      else {
         ++i;
      }
   }

   cout << mapMe << " is mapped to " << result << endl;

   return result;
}